

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chrono.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  int i;
  long lVar12;
  long lVar13;
  int i_2;
  ulong uVar14;
  double dVar15;
  double dVar16;
  vector<double,_std::allocator<double>_> v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  vector<double,_std::allocator<double>_> v2;
  string output_dir;
  string mkdir_command;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_670;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_658;
  ifstream f;
  ofstream timings;
  uint auStack_418 [122];
  ofstream output_file;
  
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&f,"../data/0_rse_workshop.dat",(allocator<char> *)&output_file);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&data_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&f,"../data/1_rse_workshop.dat",(allocator<char> *)&output_file);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&data_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&f,"../data/2_rse_workshop.dat",(allocator<char> *)&output_file);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&data_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  std::__cxx11::string::~string((string *)&f);
  std::ifstream::ifstream
            (&f,(string *)
                data_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,_S_in);
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_670,(istream_type *)&f);
  local_658._M_stream = (istream_type *)0x0;
  local_658._M_value = 0.0;
  local_658._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&v,&local_670,&local_658,
             (allocator_type *)&output_file);
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar2 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar15 = 0.0;
  for (lVar12 = 0; lVar2 != lVar12; lVar12 = lVar12 + 1) {
    dVar15 = dVar15 + v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12];
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar4 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar16 = 0.0;
  for (lVar13 = 0; lVar4 != lVar13; lVar13 = lVar13 + 1) {
    dVar16 = dVar16 + v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13] *
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13];
  }
  dVar15 = dVar15 / (double)lVar2;
  dVar15 = dVar16 / (double)lVar4 - dVar15 * dVar15;
  lVar2 = std::chrono::_V2::system_clock::now();
  if (dVar15 < 0.0) {
    sqrt(dVar15);
  }
  std::vector<double,_std::allocator<double>_>::vector(&v2,&v);
  lVar4 = std::chrono::_V2::system_clock::now();
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  lVar13 = std::chrono::_V2::system_clock::now();
  lVar5 = std::chrono::_V2::system_clock::now();
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar7 = std::chrono::_V2::system_clock::now();
  lVar8 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_dir,"./output",(allocator<char> *)&output_file);
  std::operator+(&mkdir_command,"mkdir -p ",&output_dir);
  system(mkdir_command._M_dataplus._M_p);
  lVar9 = std::chrono::_V2::system_clock::now();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&timings,
                 &output_dir,"/results.dat");
  std::ofstream::ofstream(&output_file,(string *)&timings,_S_out);
  std::__cxx11::string::~string((string *)&timings);
  std::ostream::_M_insert<double>
            (*v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  for (uVar14 = 1;
      uVar14 < (ulong)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1) {
    std::operator<<((ostream *)&output_file,',');
    std::ostream::_M_insert<double>
              (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar14]);
  }
  std::ofstream::close();
  lVar10 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&timings,"timings_0.csv",_S_app);
  *(uint *)((long)auStack_418 + *(long *)(_timings + -0x18)) =
       *(uint *)((long)auStack_418 + *(long *)(_timings + -0x18)) & 0xfffffefb | 4;
  poVar11 = std::ostream::_M_insert<double>((double)(lVar10 - lVar9) / 1000000.0);
  std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<double>((double)(lVar12 - lVar1) / 1000000.0);
  std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<double>((double)(lVar2 - lVar3) / 1000000.0);
  std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<double>((double)(lVar13 - lVar4) / 1000000.0);
  std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<double>((double)(lVar6 - lVar5) / 1000000.0);
  std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<double>((double)(lVar8 - lVar7) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar11);
  std::ofstream::close();
  std::ofstream::~ofstream(&timings);
  std::ofstream::~ofstream(&output_file);
  std::__cxx11::string::~string((string *)&mkdir_command);
  std::__cxx11::string::~string((string *)&output_dir);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::ifstream::~ifstream(&f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&data_files);
  return 0;
}

Assistant:

int main()
{
  // Declare start and end points for timings with chrono
  std::chrono::high_resolution_clock::time_point t1;
  std::chrono::high_resolution_clock::time_point t2;
  
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find some pre-prepared data files
    std::vector<std::string> data_files;
    data_files.push_back("../data/0_rse_workshop.dat");
    data_files.push_back("../data/1_rse_workshop.dat");
    data_files.push_back("../data/2_rse_workshop.dat");


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    // Compute mean
    t1 = std::chrono::high_resolution_clock::now();
    double sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i];
    }
    const double mean = sum / v.size();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> reduce = t2 - t1;
    
    // Compute standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i] * v[i];
    }
    const double var = sum / v.size() - mean * mean;
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> transform_reduce = t2 - t1;
    
    // Compute variance
    const double std = std::sqrt(var);

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    sum = 0.0;
    double one_over_sigma3 = 1.0 / (std * std * std);
    for (int i = 0; i < v.size(); i++)
    {
        sum += (v[i] - mean) * (v[i] - mean) * (v[i] - mean) * one_over_sigma3;
    }
    const double skew = sum / v.size();

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;
    t1 = std::chrono::high_resolution_clock::now();
    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> nth_element = t2 - t1;
    
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    t1 = std::chrono::high_resolution_clock::now();
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> any_of = t2 - t1;

    // First position where consecutive elements differ by more than twice the standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> mismatch = t2 - t1;

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> writeData = t2 - t1;

    ////////////////////////////////////////////////////////////////////////////////

        ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// Writing timings to csv file checkpoint_xx/timings.csv
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    std::ofstream timings("timings_0.csv", std::ios::app);
    timings << std::fixed << writeData.count() << ", "
	    << reduce.count() << ", "
	    << transform_reduce.count() << ", "
	    << nth_element.count() << ", "
	    << any_of.count() << ", "
	    << mismatch.count() << std::endl;
    timings.close();
}